

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  int iVar1;
  Expr *p;
  Table *pTVar2;
  Window **ppWVar3;
  Expr *pE;
  long lVar4;
  int iVar5;
  ExprList_item *pEVar6;
  int iCol;
  char *local_60;
  int local_54;
  Parse *local_50;
  NameContext *local_48;
  ExprList *local_40;
  Window **local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_54 = pSelect->pEList->nExpr;
  local_50 = pNC->pParse;
  pEVar6 = pOrderBy->a;
  local_38 = &pSelect->pWin;
  iVar5 = 0;
  local_60 = zType;
  local_48 = pNC;
  local_40 = pOrderBy;
  do {
    if (local_40->nExpr <= iVar5) {
      iVar5 = sqlite3ResolveOrderGroupBy(local_50,pSelect,local_40,local_60);
      return iVar5;
    }
    pExpr = pEVar6->pExpr;
    p = sqlite3ExprSkipCollate(pExpr);
    if ((*local_60 == 'G') ||
       (iCol = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,pE), iCol < 1)) {
      iVar1 = sqlite3ExprIsInteger(p,&iCol);
      if (iVar1 != 0) {
        if (iCol - 0x10000U < 0xffff0001) {
          resolveOutOfRangeError(local_50,local_60,iVar5 + 1,local_54);
          return 1;
        }
        goto LAB_00154f82;
      }
      (pEVar6->u).x.iOrderByCol = 0;
      iVar1 = sqlite3ResolveExprNames(local_48,pExpr);
      if (iVar1 != 0) {
        return 1;
      }
      for (lVar4 = 0; lVar4 < pSelect->pEList->nExpr; lVar4 = lVar4 + 1) {
        iVar1 = sqlite3ExprCompare((Parse *)0x0,pExpr,pSelect->pEList->a[lVar4].pExpr,-1);
        if (iVar1 == 0) {
          ppWVar3 = local_38;
          if ((pExpr->flags & 0x1000000) != 0) {
            while (pTVar2 = (Table *)*ppWVar3, pTVar2 != (Table *)0x0) {
              if (pTVar2 == (pExpr->y).pTab) {
                pTVar2 = (Table *)pTVar2->pCheck;
                *ppWVar3 = (Window *)pTVar2;
              }
              ppWVar3 = (Window **)&pTVar2->pCheck;
            }
          }
          (pEVar6->u).x.iOrderByCol = (short)lVar4 + 1;
        }
      }
    }
    else {
LAB_00154f82:
      (pEVar6->u).x.iOrderByCol = (u16)iCol;
    }
    iVar5 = iVar5 + 1;
    pEVar6 = pEVar6 + 1;
  } while( true );
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pE, EP_WinFunc) ){
          /* Since this window function is being changed into a reference
          ** to the same window function the result set, remove the instance
          ** of this window function from the Select.pWin list. */
          Window **pp;
          for(pp=&pSelect->pWin; *pp; pp=&(*pp)->pNextWin){
            if( *pp==pE->y.pWin ){
              *pp = (*pp)->pNextWin;
            }    
          }
        }
#endif
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}